

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9SaveAig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  int fArea;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ah"), iVar2 != -1) {
    if (iVar2 != 0x61) {
      Abc_Print(-2,"usage: &saveaig [-ah]\n");
      Abc_Print(-2,"\t        saves the current AIG into the internal storage\n");
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-a    : toggle saving AIG with the smaller area [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    if ((bVar1) && (pAbc->pGiaSaved != (Gia_Man_t *)0x0)) {
      iVar2 = Gia_ManAndNum(pAbc->pGiaSaved);
      iVar3 = Gia_ManAndNum(pAbc->pGia);
      if (iVar2 <= iVar3) {
        return 0;
      }
    }
    Gia_ManStopP(&pAbc->pGiaSaved);
    pGVar4 = Gia_ManDupWithAttributes(pAbc->pGia);
    pAbc->pGiaSaved = pGVar4;
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9SaveAig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fArea = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fArea ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fArea && pAbc->pGiaSaved != NULL && Gia_ManAndNum(pAbc->pGiaSaved) <= Gia_ManAndNum(pAbc->pGia) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaSaved );
    pAbc->pGiaSaved = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &saveaig [-ah]\n" );
    Abc_Print( -2, "\t        saves the current AIG into the internal storage\n" );
    Abc_Print( -2, "\t-a    : toggle saving AIG with the smaller area [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}